

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

bool __thiscall
cmUVProcessChain::InternalData::Prepare(InternalData *this,cmUVProcessChainBuilder *builder)

{
  StdioType SVar1;
  int iVar2;
  const_reference pvVar3;
  uv_stream_t *puVar4;
  uv_pipe_ptr *this_00;
  uv_loop_t *puVar5;
  uv_pipe_s *handle;
  uv_file local_48;
  undefined4 local_44;
  int pipeFd [2];
  StreamData<std::basic_istream<char,_std::char_traits<char>_>_> *errorData;
  value_type *error;
  StreamData<std::basic_istream<char,_std::char_traits<char>_>_> *outputData;
  value_type *output;
  cmUVProcessChainBuilder *builder_local;
  InternalData *this_local;
  
  this->Builder = builder;
  pvVar3 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,1);
  SVar1 = pvVar3->Type;
  if (SVar1 == None) {
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_IGNORE;
  }
  else if (SVar1 == Builtin) {
    puVar5 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    ::cm::uv_pipe_ptr::init
              (&(this->OutputStreamData).super_BasicStreamData.BuiltinStream,(EVP_PKEY_CTX *)puVar5)
    ;
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
    puVar4 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                       (&(this->OutputStreamData).super_BasicStreamData.BuiltinStream);
    (this->OutputStreamData).super_BasicStreamData.Stdio.data.stream = puVar4;
  }
  else if (SVar1 == External) {
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_INHERIT_FD;
    (this->OutputStreamData).super_BasicStreamData.Stdio.data.fd = pvVar3->FileDescriptor;
  }
  pvVar3 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,2);
  pipeFd = (int  [2])&this->ErrorStreamData;
  SVar1 = pvVar3->Type;
  if (SVar1 == None) {
    (this->ErrorStreamData).super_BasicStreamData.Stdio.flags = UV_IGNORE;
  }
  else if (SVar1 == Builtin) {
    iVar2 = cmGetPipes(&local_48);
    if (iVar2 < 0) {
      return false;
    }
    this_00 = (uv_pipe_ptr *)((long)pipeFd + 0x78);
    puVar5 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    ::cm::uv_pipe_ptr::init(this_00,(EVP_PKEY_CTX *)puVar5);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_ *)((long)pipeFd + 0x78));
    iVar2 = uv_pipe_open(handle,local_48);
    if (iVar2 < 0) {
      return false;
    }
    *(undefined4 *)((long)pipeFd + 0x88) = 2;
    *(undefined4 *)((long)pipeFd + 0x90) = local_44;
  }
  else if (SVar1 == External) {
    (this->ErrorStreamData).super_BasicStreamData.Stdio.flags = UV_INHERIT_FD;
    (this->ErrorStreamData).super_BasicStreamData.Stdio.data.fd = pvVar3->FileDescriptor;
  }
  return true;
}

Assistant:

bool cmUVProcessChain::InternalData::Prepare(
  const cmUVProcessChainBuilder* builder)
{
  this->Builder = builder;

  auto const& output =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT];
  auto& outputData = this->OutputStreamData;
  switch (output.Type) {
    case cmUVProcessChainBuilder::None:
      outputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin:
      outputData.BuiltinStream.init(*this->Loop, 0);
      outputData.Stdio.flags =
        static_cast<uv_stdio_flags>(UV_CREATE_PIPE | UV_WRITABLE_PIPE);
      outputData.Stdio.data.stream = outputData.BuiltinStream;
      break;

    case cmUVProcessChainBuilder::External:
      outputData.Stdio.flags = UV_INHERIT_FD;
      outputData.Stdio.data.fd = output.FileDescriptor;
      break;
  }

  auto const& error =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR];
  auto& errorData = this->ErrorStreamData;
  switch (error.Type) {
    case cmUVProcessChainBuilder::None:
      errorData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      errorData.BuiltinStream.init(*this->Loop, 0);
      if (uv_pipe_open(errorData.BuiltinStream, pipeFd[0]) < 0) {
        return false;
      }
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = pipeFd[1];
      break;
    }

    case cmUVProcessChainBuilder::External:
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = error.FileDescriptor;
      break;
  }

  return true;
}